

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
poly::
vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
::vector(vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
         *this,vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
               *other)

{
  my_base *pmVar1;
  elem_ptr_pointer pvVar2;
  size_type sVar3;
  elem_ptr_const_pointer begin;
  elem_ptr_const_pointer _free;
  elem_ptr_const_pointer end;
  poly_copy_descr local_30;
  vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
  *local_18;
  vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
  *other_local;
  vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
  *this_local;
  
  local_18 = other;
  other_local = this;
  pmVar1 = base(other);
  vector_impl::
  allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>_>
  ::allocator_base(&this->
                    super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>_>
                   ,pmVar1);
  pvVar2 = begin_elem(this);
  this->_free_elem = pvVar2;
  pvVar2 = begin_elem(this);
  sVar3 = capacity(local_18);
  this->_begin_storage = pvVar2 + sVar3;
  this->_align_max = local_18->_align_max;
  pmVar1 = base(this);
  pvVar2 = begin_elem(this);
  begin = begin_elem(local_18);
  _free = end_elem(local_18);
  end = last_elem(local_18);
  sVar3 = max_align(local_18);
  poly_uninitialized_copy(&local_30,pmVar1,pvVar2,begin,_free,end,sVar3);
  set_ptrs(this,&local_30);
  return;
}

Assistant:

inline vector<I, A, C>::vector(const vector& other)
    : vector_impl::allocator_base<allocator_type>(other.base())
    , _free_elem { begin_elem() }
    , _begin_storage { begin_elem() + other.capacity() }
    , _align_max { other._align_max }
{
    set_ptrs(poly_uninitialized_copy(base(), begin_elem(), other.begin_elem(), other.end_elem(),
        other.last_elem(), other.max_align()));
}